

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfilingHelpers.cpp
# Opt level: O2

Var Js::ProfilingHelpers::ProfiledLdFld<false,false,true>
              (Var instance,PropertyId propertyId,InlineCache *inlineCache,
              InlineCacheIndex inlineCacheIndex,FunctionBody *functionBody,Var thisInstance)

{
  code *pcVar1;
  undefined8 object;
  PropertyId propertyId_00;
  InlineCache *inlineCache_00;
  bool bVar2;
  FldInfoFlags FVar3;
  FldInfoFlags FVar4;
  uint uVar5;
  undefined4 *puVar6;
  ScriptContext *requestContext;
  DynamicProfileInfo *this;
  RecyclableObject *object_00;
  RecyclableObject *thisInstance_00;
  FldInfo *pFVar7;
  InlineCacheIndex fieldAccessId;
  undefined1 local_a8 [8];
  PropertyValueInfo propertyValueInfo;
  Var local_50;
  Var value;
  InlineCache *local_40;
  InlineCacheIndex local_38;
  PropertyCacheOperationInfo local_34;
  FldInfoFlags local_31 [5];
  PropertyCacheOperationInfo operationInfo;
  
  local_40 = inlineCache;
  local_38 = inlineCacheIndex;
  if (instance == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x3ae,"(instance)","instance");
    if (!bVar2) goto LAB_009dceb8;
    *puVar6 = 0;
  }
  if (thisInstance == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x3af,"(thisInstance)","thisInstance");
    if (!bVar2) goto LAB_009dceb8;
    *puVar6 = 0;
  }
  value._4_4_ = propertyId;
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x3b0,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar2) goto LAB_009dceb8;
    *puVar6 = 0;
  }
  if (local_40 == (InlineCache *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x3b1,"(inlineCache)","inlineCache");
    if (!bVar2) goto LAB_009dceb8;
    *puVar6 = 0;
  }
  if (functionBody == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x3b2,"(functionBody)","functionBody");
    if (!bVar2) goto LAB_009dceb8;
    *puVar6 = 0;
  }
  uVar5 = FunctionBody::GetInlineCacheCount(functionBody);
  if (uVar5 <= local_38) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x3b3,"(inlineCacheIndex < functionBody->GetInlineCacheCount())",
                                "inlineCacheIndex < functionBody->GetInlineCacheCount()");
    if (!bVar2) {
LAB_009dceb8:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(instance);
  requestContext = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  this = FunctionBody::GetDynamicProfileInfo(functionBody);
  bVar2 = VarIs<Js::RecyclableObject>(instance);
  if (bVar2) {
    bVar2 = VarIs<Js::RecyclableObject>(thisInstance);
    if (bVar2) {
      object_00 = UnsafeVarTo<Js::RecyclableObject>(instance);
      thisInstance_00 = UnsafeVarTo<Js::RecyclableObject>(thisInstance);
      local_34.cacheType = CacheType_None;
      local_34.slotType = SlotType_None;
      local_34.isPolymorphic = false;
      local_a8 = (undefined1  [8])0x0;
      propertyValueInfo.m_instance = (RecyclableObject *)0x50000ffff;
      propertyValueInfo.m_propertyIndex = 0;
      propertyValueInfo.m_attributes = '\0';
      propertyValueInfo.flags = InlineCacheNoFlags;
      propertyValueInfo.cacheInfoFlag = 0;
      propertyValueInfo.inlineCache = (InlineCache *)0x0;
      propertyValueInfo.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
      propertyValueInfo.functionBody = (FunctionBody *)0x0;
      propertyValueInfo.prop = (RecyclableObject *)0x0;
      propertyValueInfo.propertyRecordUsageCache._0_4_ = 0xffffffff;
      propertyValueInfo.propertyRecordUsageCache._5_1_ = 1;
      PropertyValueInfo::SetCacheInfo
                ((PropertyValueInfo *)local_a8,functionBody,local_40,local_38,true);
      propertyId_00 = value._4_4_;
      bVar2 = CacheOperators::TryGetProperty<true,true,true,true,true,true,true,false,true,false>
                        (object_00,false,object_00,value._4_4_,&local_50,requestContext,&local_34,
                         (PropertyValueInfo *)local_a8);
      fieldAccessId = local_38;
      propertyValueInfo._56_8_ = object_00;
      if (bVar2) {
        pFVar7 = DynamicProfileInfo::GetFldInfo(this,functionBody,local_38);
        FVar4 = pFVar7->flags;
        if (FVar4 != FldInfo_NoInfo) {
          FVar3 = DynamicProfileInfo::FldInfoFlagsFromCacheType(local_34.cacheType);
          if ((FVar3 & FVar4) == FldInfo_NoInfo) {
            local_31[0] = DynamicProfileInfo::MergeFldInfoFlags(FldInfo_NoInfo,FldInfo_Polymorphic);
            FVar4 = local_31[0];
            goto LAB_009dce00;
          }
        }
        FVar4 = FldInfo_NoInfo;
      }
      else {
        local_50 = JavascriptOperators::PatchGetValueWithThisPtrNoFastPath
                             (functionBody,local_40,local_38,object_00,propertyId_00,thisInstance_00
                             );
        CacheOperators::PretendTryGetProperty<true,false>
                  ((object_00->type).ptr,&local_34,(PropertyValueInfo *)local_a8);
        FVar4 = FldInfo_NoInfo;
      }
LAB_009dce00:
      if (local_34.isPolymorphic == true) {
        FVar4 = DynamicProfileInfo::MergeFldInfoFlags(FVar4,FldInfo_Polymorphic);
      }
      FVar3 = DynamicProfileInfo::FldInfoFlagsFromCacheType(local_34.cacheType);
      FVar4 = DynamicProfileInfo::MergeFldInfoFlags(FVar4,FVar3);
      FVar3 = DynamicProfileInfo::FldInfoFlagsFromSlotType(local_34.slotType);
      local_31[0] = DynamicProfileInfo::MergeFldInfoFlags(FVar4,FVar3);
      inlineCache_00 = local_40;
      object = propertyValueInfo._56_8_;
      UpdateFldInfoFlagsForGetSetInlineCandidate
                ((RecyclableObject *)propertyValueInfo._56_8_,local_31,local_34.cacheType,local_40,
                 functionBody);
      UpdateFldInfoFlagsForCallApplyInlineCandidate
                ((RecyclableObject *)object,local_31,CacheType_None,inlineCache_00,functionBody);
      FVar4 = local_31[0];
      goto LAB_009dce7e;
    }
  }
  fieldAccessId = local_38;
  local_50 = JavascriptOperators::PatchGetValue<false,Js::InlineCache>
                       (functionBody,local_40,local_38,instance,value._4_4_);
  FVar4 = FldInfo_NoInfo;
LAB_009dce7e:
  DynamicProfileInfo::RecordFieldAccess(this,functionBody,fieldAccessId,local_50,FVar4);
  return local_50;
}

Assistant:

Var ProfilingHelpers::ProfiledLdFld(
        const Var instance,
        const PropertyId propertyId,
        InlineCache *const inlineCache,
        const InlineCacheIndex inlineCacheIndex,
        FunctionBody *const functionBody,
        const Var thisInstance)
    {
        Assert(instance);
        Assert(thisInstance);
        Assert(propertyId != Constants::NoProperty);
        Assert(inlineCache);
        Assert(functionBody);
        Assert(inlineCacheIndex < functionBody->GetInlineCacheCount());
        Assert(!Root || inlineCacheIndex >= functionBody->GetRootObjectLoadInlineCacheStart());

#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(instance);
#endif
        ScriptContext *const scriptContext = functionBody->GetScriptContext();
        DynamicProfileInfo *const dynamicProfileInfo = functionBody->GetDynamicProfileInfo();
        Var value;
        FldInfoFlags fldInfoFlags = FldInfo_NoInfo;
        if (Root || (VarIs<RecyclableObject>(instance) && VarIs<RecyclableObject>(thisInstance)))
        {
            RecyclableObject *const object = UnsafeVarTo<RecyclableObject>(instance);
            RecyclableObject *const thisObject = UnsafeVarTo<RecyclableObject>(thisInstance);

            if (!Root && Method && (propertyId == PropertyIds::apply || propertyId == PropertyIds::call) && VarIs<ScriptFunction>(object))
            {
                // If the property being loaded is "apply"/"call", make an optimistic assumption that apply/call is not overridden and
                // undefer the function right here if it was defer parsed before. This is required so that the load of "apply"/"call"
                // happens from the same "type". Otherwise, we will have a polymorphic cache for load of "apply"/"call".
                ScriptFunction *fn = UnsafeVarTo<ScriptFunction>(object);
                if (fn->GetType()->GetEntryPoint() == JavascriptFunction::DeferredParsingThunk)
                {
                    JavascriptFunction::DeferredParse(&fn);
                }
            }

            PropertyCacheOperationInfo operationInfo;
            PropertyValueInfo propertyValueInfo;
            PropertyValueInfo::SetCacheInfo(&propertyValueInfo, functionBody, inlineCache, inlineCacheIndex, true);
            if (!CacheOperators::TryGetProperty<true, true, true, !Root && !Method, true, !Root, true, false, true, false>(
                    object,
                    Root,
                    object,
                    propertyId,
                    &value,
                    scriptContext,
                    &operationInfo,
                    &propertyValueInfo))
            {
                const auto PatchGetValue = &JavascriptOperators::PatchGetValueWithThisPtrNoFastPath;
                const auto PatchGetRootValue = &JavascriptOperators::PatchGetRootValueNoFastPath_Var;
                const auto PatchGetMethod = &JavascriptOperators::PatchGetMethodNoFastPath;
                const auto PatchGetRootMethod = &JavascriptOperators::PatchGetRootMethodNoFastPath_Var;
                const auto PatchGet =
                    Root
                        ? Method ? PatchGetRootMethod : PatchGetRootValue
                        : PatchGetMethod ;
                value = (!Root && !Method) ? PatchGetValue(functionBody, inlineCache, inlineCacheIndex, object, propertyId, thisObject) :
                    PatchGet(functionBody, inlineCache, inlineCacheIndex, object, propertyId);
                CacheOperators::PretendTryGetProperty<true, false>(object->GetType(), &operationInfo, &propertyValueInfo);
            }
            else if (!Root && !Method)
            {
                // Inline cache hit. oldflags must match the new ones. If not there is mark it as polymorphic as there is likely
                // a bailout to interpreter and change in the inline cache type.
                const FldInfoFlags oldflags = dynamicProfileInfo->GetFldInfo(functionBody, inlineCacheIndex)->flags;
                if ((oldflags != FldInfo_NoInfo) &&
                    !(oldflags & DynamicProfileInfo::FldInfoFlagsFromCacheType(operationInfo.cacheType)))
                {
                    fldInfoFlags = DynamicProfileInfo::MergeFldInfoFlags(fldInfoFlags, FldInfo_Polymorphic);
                }
            }

            if (!Root && operationInfo.isPolymorphic)
            {
                fldInfoFlags = DynamicProfileInfo::MergeFldInfoFlags(fldInfoFlags, FldInfo_Polymorphic);
            }
            fldInfoFlags =
                DynamicProfileInfo::MergeFldInfoFlags(
                    fldInfoFlags,
                    DynamicProfileInfo::FldInfoFlagsFromCacheType(operationInfo.cacheType));
            fldInfoFlags =
                DynamicProfileInfo::MergeFldInfoFlags(
                    fldInfoFlags,
                    DynamicProfileInfo::FldInfoFlagsFromSlotType(operationInfo.slotType));

            if (!Method)
            {
                UpdateFldInfoFlagsForGetSetInlineCandidate(
                    object,
                    fldInfoFlags,
                    operationInfo.cacheType,
                    inlineCache,
                    functionBody);
                if (!Root && CallApplyTarget)
                {
                    UpdateFldInfoFlagsForCallApplyInlineCandidate(
                        object,
                        fldInfoFlags,
                        operationInfo.cacheType,
                        inlineCache,
                        functionBody);
                }
            }
        }
        else
        {
            Assert(!Root);
            const auto PatchGetValue = &JavascriptOperators::PatchGetValue<false, InlineCache>;
            const auto PatchGetMethod = &JavascriptOperators::PatchGetMethod<false, InlineCache>;
            const auto PatchGet = Method ? PatchGetMethod : PatchGetValue;
            value = PatchGet(functionBody, inlineCache, inlineCacheIndex, instance, propertyId);
        }

        dynamicProfileInfo->RecordFieldAccess(functionBody, inlineCacheIndex, value, fldInfoFlags);
        return value;
    }